

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintStamp.cpp
# Opt level: O3

void __thiscall OpenMD::RestraintStamp::RestraintStamp(RestraintStamp *this)

{
  _Rb_tree_header *p_Var1;
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  ParameterBase *local_e0;
  string *local_d8;
  ParameterBase *local_d0;
  string *local_c8;
  ParameterBase *local_c0;
  string *local_b8;
  ParameterBase *local_b0;
  string *local_a8;
  ParameterBase *local_a0;
  string *local_98;
  ParameterBase *local_90;
  string *local_88;
  ParameterBase *local_80;
  string *local_78;
  ParameterBase *local_70;
  string *local_68;
  ParameterBase *local_60;
  string *local_58;
  ParameterBase *local_50;
  ParameterBase *local_48;
  string *local_40;
  ParameterBase *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__RestraintStamp_00309888;
  local_38 = &(this->Type).super_ParameterBase;
  (this->Type).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Type).super_ParameterBase.keyword_.field_2;
  (this->Type).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Type).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Type).super_ParameterBase.optional_ = false;
  (this->Type).super_ParameterBase.defaultValue_ = false;
  (this->Type).super_ParameterBase.empty_ = true;
  (this->Type).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_00305a98;
  (this->Type).data_._M_dataplus._M_p = (pointer)&(this->Type).data_.field_2;
  (this->Type).data_._M_string_length = 0;
  (this->Type).data_.field_2._M_local_buf[0] = '\0';
  (this->ObjectSelection).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ObjectSelection).super_ParameterBase.keyword_.field_2;
  (this->ObjectSelection).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ObjectSelection).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ObjectSelection).super_ParameterBase.optional_ = false;
  (this->ObjectSelection).super_ParameterBase.defaultValue_ = false;
  (this->ObjectSelection).super_ParameterBase.empty_ = true;
  (this->ObjectSelection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_00305a98;
  (this->ObjectSelection).data_._M_dataplus._M_p = (pointer)&(this->ObjectSelection).data_.field_2;
  (this->ObjectSelection).data_._M_string_length = 0;
  (this->ObjectSelection).data_.field_2._M_local_buf[0] = '\0';
  local_e8 = &(this->MolIndex).super_ParameterBase.keyword_.field_2;
  (this->MolIndex).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_e8;
  (this->MolIndex).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MolIndex).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MolIndex).super_ParameterBase.optional_ = false;
  (this->MolIndex).super_ParameterBase.defaultValue_ = false;
  (this->MolIndex).super_ParameterBase.empty_ = true;
  (this->MolIndex).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00306550;
  local_f0 = &(this->DisplacementSpringConstant).super_ParameterBase.keyword_.field_2;
  (this->DisplacementSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_f0;
  (this->DisplacementSpringConstant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DisplacementSpringConstant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DisplacementSpringConstant).super_ParameterBase.optional_ = false;
  (this->DisplacementSpringConstant).super_ParameterBase.defaultValue_ = false;
  (this->DisplacementSpringConstant).super_ParameterBase.empty_ = true;
  (this->DisplacementSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003064d8;
  local_f8 = &(this->AbsoluteSpringConstant).super_ParameterBase.keyword_.field_2;
  (this->AbsoluteSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_f8;
  (this->AbsoluteSpringConstant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AbsoluteSpringConstant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AbsoluteSpringConstant).super_ParameterBase.optional_ = false;
  (this->AbsoluteSpringConstant).super_ParameterBase.defaultValue_ = false;
  (this->AbsoluteSpringConstant).super_ParameterBase.empty_ = true;
  (this->AbsoluteSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003064d8;
  local_100 = &(this->TwistSpringConstant).super_ParameterBase.keyword_.field_2;
  (this->TwistSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_100;
  (this->TwistSpringConstant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TwistSpringConstant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TwistSpringConstant).super_ParameterBase.optional_ = false;
  (this->TwistSpringConstant).super_ParameterBase.defaultValue_ = false;
  (this->TwistSpringConstant).super_ParameterBase.empty_ = true;
  (this->TwistSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003064d8;
  local_108 = &(this->SwingXSpringConstant).super_ParameterBase.keyword_.field_2;
  (this->SwingXSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_108;
  (this->SwingXSpringConstant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SwingXSpringConstant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SwingXSpringConstant).super_ParameterBase.optional_ = false;
  (this->SwingXSpringConstant).super_ParameterBase.defaultValue_ = false;
  (this->SwingXSpringConstant).super_ParameterBase.empty_ = true;
  (this->SwingXSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003064d8;
  local_110 = &(this->SwingYSpringConstant).super_ParameterBase.keyword_.field_2;
  (this->SwingYSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_110;
  (this->SwingYSpringConstant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SwingYSpringConstant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SwingYSpringConstant).super_ParameterBase.optional_ = false;
  (this->SwingYSpringConstant).super_ParameterBase.defaultValue_ = false;
  (this->SwingYSpringConstant).super_ParameterBase.empty_ = true;
  (this->SwingYSpringConstant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003064d8;
  local_118 = &(this->AbsolutePositionZ).super_ParameterBase.keyword_.field_2;
  (this->AbsolutePositionZ).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_118;
  (this->AbsolutePositionZ).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AbsolutePositionZ).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AbsolutePositionZ).super_ParameterBase.optional_ = false;
  (this->AbsolutePositionZ).super_ParameterBase.defaultValue_ = false;
  (this->AbsolutePositionZ).super_ParameterBase.empty_ = true;
  (this->AbsolutePositionZ).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003064d8;
  local_120 = &(this->RestrainedTwistAngle).super_ParameterBase.keyword_.field_2;
  (this->RestrainedTwistAngle).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_120;
  (this->RestrainedTwistAngle).super_ParameterBase.keyword_._M_string_length = 0;
  (this->RestrainedTwistAngle).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->RestrainedTwistAngle).super_ParameterBase.optional_ = false;
  (this->RestrainedTwistAngle).super_ParameterBase.defaultValue_ = false;
  (this->RestrainedTwistAngle).super_ParameterBase.empty_ = true;
  (this->RestrainedTwistAngle).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003064d8;
  local_128 = &(this->RestrainedSwingXAngle).super_ParameterBase.keyword_.field_2;
  (this->RestrainedSwingXAngle).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_128;
  (this->RestrainedSwingXAngle).super_ParameterBase.keyword_._M_string_length = 0;
  (this->RestrainedSwingXAngle).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->RestrainedSwingXAngle).super_ParameterBase.optional_ = false;
  (this->RestrainedSwingXAngle).super_ParameterBase.defaultValue_ = false;
  (this->RestrainedSwingXAngle).super_ParameterBase.empty_ = true;
  (this->RestrainedSwingXAngle).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003064d8;
  local_130 = &(this->RestrainedSwingYAngle).super_ParameterBase.keyword_.field_2;
  (this->RestrainedSwingYAngle).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_130;
  (this->RestrainedSwingYAngle).super_ParameterBase.keyword_._M_string_length = 0;
  (this->RestrainedSwingYAngle).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->RestrainedSwingYAngle).super_ParameterBase.optional_ = false;
  (this->RestrainedSwingYAngle).super_ParameterBase.defaultValue_ = false;
  (this->RestrainedSwingYAngle).super_ParameterBase.empty_ = true;
  (this->RestrainedSwingYAngle).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_003064d8;
  local_138 = &(this->Print).super_ParameterBase.keyword_.field_2;
  (this->Print).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_138;
  (this->Print).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Print).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Print).super_ParameterBase.optional_ = false;
  (this->Print).super_ParameterBase.defaultValue_ = false;
  local_50 = &(this->ObjectSelection).super_ParameterBase;
  (this->Print).super_ParameterBase.empty_ = true;
  (this->Print).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_00306460
  ;
  paVar2 = &local_180.first.field_2;
  local_48 = &(this->MolIndex).super_ParameterBase;
  local_40 = (string *)&(this->MolIndex).super_ParameterBase.keyword_;
  local_60 = &(this->DisplacementSpringConstant).super_ParameterBase;
  local_58 = (string *)&(this->DisplacementSpringConstant).super_ParameterBase.keyword_;
  local_70 = &(this->AbsoluteSpringConstant).super_ParameterBase;
  local_68 = (string *)&(this->AbsoluteSpringConstant).super_ParameterBase.keyword_;
  local_80 = &(this->TwistSpringConstant).super_ParameterBase;
  local_78 = (string *)&(this->TwistSpringConstant).super_ParameterBase.keyword_;
  local_90 = &(this->SwingXSpringConstant).super_ParameterBase;
  local_88 = (string *)&(this->SwingXSpringConstant).super_ParameterBase.keyword_;
  local_a0 = &(this->SwingYSpringConstant).super_ParameterBase;
  local_98 = (string *)&(this->SwingYSpringConstant).super_ParameterBase.keyword_;
  local_b0 = &(this->AbsolutePositionZ).super_ParameterBase;
  local_a8 = (string *)&(this->AbsolutePositionZ).super_ParameterBase.keyword_;
  local_c0 = &(this->RestrainedTwistAngle).super_ParameterBase;
  local_b8 = (string *)&(this->RestrainedTwistAngle).super_ParameterBase.keyword_;
  local_d0 = &(this->RestrainedSwingXAngle).super_ParameterBase;
  local_c8 = (string *)&(this->RestrainedSwingXAngle).super_ParameterBase.keyword_;
  local_e0 = &(this->RestrainedSwingYAngle).super_ParameterBase;
  local_d8 = (string *)&(this->RestrainedSwingYAngle).super_ParameterBase.keyword_;
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"restraintType","");
  std::__cxx11::string::_M_assign((string *)&(this->Type).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"restraintType","");
  this_00 = &(this->super_DataHolder).parameters_;
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_38;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"molIndex","");
  std::__cxx11::string::_M_assign(local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->MolIndex).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"molIndex","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_48;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"objectSelection","");
  std::__cxx11::string::_M_assign((string *)&(this->ObjectSelection).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->ObjectSelection).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"objectSelection","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_50;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"displacementSpringConstant","");
  std::__cxx11::string::_M_assign(local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->DisplacementSpringConstant).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"displacementSpringConstant","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_60;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"absoluteSpringConstant","");
  std::__cxx11::string::_M_assign(local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->AbsoluteSpringConstant).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"absoluteSpringConstant","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_70;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"twistSpringConstant","");
  std::__cxx11::string::_M_assign(local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->TwistSpringConstant).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"twistSpringConstant","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_80;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"swingXSpringConstant","");
  std::__cxx11::string::_M_assign(local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->SwingXSpringConstant).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"swingXSpringConstant","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_90;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"swingYSpringConstant","");
  std::__cxx11::string::_M_assign(local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->SwingYSpringConstant).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"swingYSpringConstant","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_a0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"absolutePositionZ","");
  std::__cxx11::string::_M_assign(local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->AbsolutePositionZ).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"absolutePositionZ","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_b0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"restrainedTwistAngle","");
  std::__cxx11::string::_M_assign(local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->RestrainedTwistAngle).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"restrainedTwistAngle","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_c0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"restrainedSwingXAngle","");
  std::__cxx11::string::_M_assign(local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->RestrainedSwingXAngle).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"restrainedSwingXAngle","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_d0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"restrainedSwingYAngle","");
  std::__cxx11::string::_M_assign(local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->RestrainedSwingYAngle).super_ParameterBase.optional_ = true;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"restrainedSwingYAngle","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = local_e0;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  local_180.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"print","");
  std::__cxx11::string::_M_assign((string *)&(this->Print).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  (this->Print).super_ParameterBase.optional_ = true;
  (this->Print).super_ParameterBase.defaultValue_ = true;
  (this->Print).super_ParameterBase.empty_ = false;
  (this->Print).super_ParameterBase.field_0x2b = 1;
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"print","");
  if (local_158 == &local_148) {
    local_180.first.field_2._8_8_ = local_148._8_8_;
    local_180.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_180.first._M_dataplus._M_p = (pointer)local_158;
  }
  local_180.first.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_180.first.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_180.first._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_180.second = &(this->Print).super_ParameterBase;
  local_158 = &local_148;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_180.first._M_dataplus._M_p,
                    local_180.first.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,
                    CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

RestraintStamp::RestraintStamp() {
    DefineParameter(Type, "restraintType");

    DefineOptionalParameter(MolIndex, "molIndex");
    DefineOptionalParameter(ObjectSelection, "objectSelection");
    DefineOptionalParameter(DisplacementSpringConstant,
                            "displacementSpringConstant");
    DefineOptionalParameter(AbsoluteSpringConstant, "absoluteSpringConstant");
    DefineOptionalParameter(TwistSpringConstant, "twistSpringConstant");
    DefineOptionalParameter(SwingXSpringConstant, "swingXSpringConstant");
    DefineOptionalParameter(SwingYSpringConstant, "swingYSpringConstant");

    DefineOptionalParameter(AbsolutePositionZ, "absolutePositionZ");
    DefineOptionalParameter(RestrainedTwistAngle, "restrainedTwistAngle");
    DefineOptionalParameter(RestrainedSwingXAngle, "restrainedSwingXAngle");
    DefineOptionalParameter(RestrainedSwingYAngle, "restrainedSwingYAngle");
    DefineOptionalParameterWithDefaultValue(Print, "print", true);
  }